

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexDataMaterials
          (MeshGeometry *this,vector<int,_std::allocator<int>_> *materials_out,Scope *source,
          string *MappingInformationType,string *ReferenceInformationType)

{
  string *sc;
  Scope *pSVar1;
  bool bVar2;
  Element *el;
  reference __value;
  size_type sVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  size_type local_4f0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_370;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_368;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  allocator local_59;
  string local_58;
  size_type local_38;
  size_t face_count;
  string *ReferenceInformationType_local;
  string *MappingInformationType_local;
  Scope *source_local;
  vector<int,_std::allocator<int>_> *materials_out_local;
  MeshGeometry *this_local;
  
  face_count = (size_t)ReferenceInformationType;
  ReferenceInformationType_local = MappingInformationType;
  MappingInformationType_local = (string *)source;
  source_local = (Scope *)materials_out;
  materials_out_local = (vector<int,_std::allocator<int>_> *)this;
  local_38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_faces);
  pSVar1 = source_local;
  sc = MappingInformationType_local;
  if (local_38 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"Materials",&local_59);
    el = GetRequiredElement((Scope *)sc,&local_58,(Element *)0x0);
    ParseVectorDataArray((vector<int,_std::allocator<int>_> *)pSVar1,el);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    bVar2 = std::operator==(ReferenceInformationType_local,"AllSame");
    if (bVar2) {
      bVar2 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)source_local);
      if (bVar2) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[34]>(&local_1e8,(char (*) [34])"expected material index, ignoring");
        LogFunctions<Assimp::FBXImporter>::LogError(&local_1e8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_1e8);
      }
      else {
        sVar3 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)source_local);
        if (1 < sVar3) {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[73]>
                    (&local_360,
                     (char (*) [73])
                     "expected only a single material index, ignoring all except the first one");
          LogFunctions<Assimp::FBXImporter>::LogWarn(&local_360);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_360);
          std::vector<int,_std::allocator<int>_>::clear
                    ((vector<int,_std::allocator<int>_> *)source_local);
        }
        pSVar1 = source_local;
        sVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          (&this->m_vertices);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)pSVar1,sVar3);
        local_368._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)source_local);
        local_370._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)source_local);
        __value = std::vector<int,_std::allocator<int>_>::at
                            ((vector<int,_std::allocator<int>_> *)source_local,0);
        std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                  (local_368,local_370,__value);
      }
    }
    else {
      bVar2 = std::operator==(ReferenceInformationType_local,"ByPolygon");
      if ((bVar2) &&
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)face_count,"IndexToDirect"), bVar2)) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)source_local,local_38);
        sVar3 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)source_local);
        if (sVar3 != local_38) {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    (&local_4e8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          local_4f0 = std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)source_local);
          pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              &local_4e8,&local_4f0);
          pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar4,(char (*) [12])", expected ");
          pbVar5 = Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar4,&local_38);
          LogFunctions<Assimp::FBXImporter>::LogError(pbVar5);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_4e8);
        }
      }
      else {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[61]>
                  (&local_668,
                   (char (*) [61])"ignoring material assignments, access type not implemented: ");
        pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_668,ReferenceInformationType_local);
        pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar4,(char (*) [2])0x2fb035);
        pbVar5 = Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)face_count);
        LogFunctions<Assimp::FBXImporter>::LogError(pbVar5);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_668);
      }
    }
  }
  return;
}

Assistant:

void MeshGeometry::ReadVertexDataMaterials(std::vector<int>& materials_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType)
{
    const size_t face_count = m_faces.size();
    if( 0 == face_count )
    {
        return;
    }
    
    // materials are handled separately. First of all, they are assigned per-face
    // and not per polyvert. Secondly, ReferenceInformationType=IndexToDirect
    // has a slightly different meaning for materials.
    ParseVectorDataArray(materials_out,GetRequiredElement(source,"Materials"));

    if (MappingInformationType == "AllSame") {
        // easy - same material for all faces
        if (materials_out.empty()) {
            FBXImporter::LogError(Formatter::format("expected material index, ignoring"));
            return;
        } else if (materials_out.size() > 1) {
            FBXImporter::LogWarn(Formatter::format("expected only a single material index, ignoring all except the first one"));
            materials_out.clear();
        }

        materials_out.resize(m_vertices.size());
        std::fill(materials_out.begin(), materials_out.end(), materials_out.at(0));
    } else if (MappingInformationType == "ByPolygon" && ReferenceInformationType == "IndexToDirect") {
        materials_out.resize(face_count);

        if(materials_out.size() != face_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
                << materials_out.size() << ", expected " << face_count
            );
            return;
        }
    } else {
        FBXImporter::LogError(Formatter::format("ignoring material assignments, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}